

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3ReadNextPos(char **pp,sqlite3_int64 *pi)

{
  byte bVar1;
  byte *p;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  int iVal;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  p = (byte *)*pp;
  bVar1 = *p;
  if (bVar1 < 2) {
    lVar3 = 0x7fffffffffffffff;
  }
  else {
    local_24 = 0xaaaaaaaa;
    if ((char)bVar1 < '\0') {
      uVar2 = sqlite3Fts3GetVarint32((char *)p,(int *)&local_24);
      uVar4 = (ulong)uVar2;
    }
    else {
      uVar4 = 1;
      local_24 = (uint)bVar1;
    }
    *pp = (char *)(p + uVar4);
    lVar3 = (long)(int)local_24 + *pi + -2;
  }
  *pi = lVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts3ReadNextPos(
  char **pp,                    /* IN/OUT: Pointer into position-list buffer */
  sqlite3_int64 *pi             /* IN/OUT: Value read from position-list */
){
  if( (**pp)&0xFE ){
    int iVal;
    *pp += fts3GetVarint32((*pp), &iVal);
    *pi += iVal;
    *pi -= 2;
  }else{
    *pi = POSITION_LIST_END;
  }
}